

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O0

symbol * dmrC_evaluate_statement(dmr_C *C,statement *stmt)

{
  symbol *psVar1;
  expression *peVar2;
  undefined1 local_68 [8];
  ptr_list_iter siter___1;
  symbol *type;
  statement *s_1;
  ptr_list_iter siter__;
  symbol *s;
  statement *stmt_local;
  dmr_C *C_local;
  
  if (stmt == (statement *)0x0) {
    C_local = (dmr_C *)0x0;
  }
  else {
    switch(stmt->type) {
    case STMT_NONE:
    default:
      C_local = (dmr_C *)0x0;
      break;
    case STMT_DECLARATION:
      ptrlist_forward_iterator((ptr_list_iter *)&s_1,(ptr_list *)(stmt->field_2).field_1.expression)
      ;
      siter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&s_1);
      while (siter__._16_8_ != 0) {
        evaluate_symbol(C,(symbol *)siter__._16_8_);
        siter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&s_1);
      }
      C_local = (dmr_C *)0x0;
      break;
    case STMT_EXPRESSION:
      psVar1 = dmrC_evaluate_expression(C,(stmt->field_2).field_1.expression);
      if (psVar1 == (symbol *)0x0) {
        C_local = (dmr_C *)0x0;
      }
      else {
        if (((stmt->field_2).field_1.expression)->ctype == &C->S->null_ctype) {
          peVar2 = cast_to(C,(stmt->field_2).field_1.expression,&C->S->ptr_ctype);
          (stmt->field_2).field_1.expression = peVar2;
        }
        C_local = (dmr_C *)degenerate(C,(stmt->field_2).field_1.expression);
      }
      break;
    case STMT_COMPOUND:
      siter___1.__nr = 0;
      siter___1._20_4_ = 0;
      evaluate_symbol(C,(stmt->field_2).field_2.ret_target);
      siter___1._16_8_ = dmrC_evaluate_statement(C,(stmt->field_2).field_4.args);
      ptrlist_forward_iterator
                ((ptr_list_iter *)local_68,(ptr_list *)(stmt->field_2).field_1.expression);
      type = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_68);
      while (type != (symbol *)0x0) {
        siter___1._16_8_ = dmrC_evaluate_statement(C,(statement *)type);
        type = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_68);
      }
      if (siter___1._16_8_ == 0) {
        siter___1._16_8_ = &C->S->void_ctype;
      }
      C_local = (dmr_C *)siter___1._16_8_;
      break;
    case STMT_IF:
      evaluate_if_statement(C,stmt);
      C_local = (dmr_C *)0x0;
      break;
    case STMT_RETURN:
      C_local = (dmr_C *)evaluate_return_expression(C,stmt);
      break;
    case STMT_CASE:
      evaluate_case_statement(C,stmt);
      C_local = (dmr_C *)0x0;
      break;
    case STMT_SWITCH:
      evaluate_switch_statement(C,stmt);
      C_local = (dmr_C *)0x0;
      break;
    case STMT_ITERATOR:
      evaluate_iterator(C,stmt);
      C_local = (dmr_C *)0x0;
      break;
    case STMT_LABEL:
      C_local = (dmr_C *)dmrC_evaluate_statement(C,(stmt->field_2).field_3.if_true);
      break;
    case STMT_GOTO:
      evaluate_goto_statement(C,stmt);
      C_local = (dmr_C *)0x0;
      break;
    case STMT_ASM:
      evaluate_asm_statement(C,stmt);
      C_local = (dmr_C *)0x0;
      break;
    case STMT_CONTEXT:
      dmrC_evaluate_expression(C,(stmt->field_2).field_1.expression);
      C_local = (dmr_C *)0x0;
      break;
    case STMT_RANGE:
      dmrC_evaluate_expression(C,(stmt->field_2).field_1.expression);
      dmrC_evaluate_expression(C,(stmt->field_2).field_1.context);
      dmrC_evaluate_expression(C,(stmt->field_2).field_11.range_high);
      C_local = (dmr_C *)0x0;
    }
  }
  return (symbol *)C_local;
}

Assistant:

struct symbol *dmrC_evaluate_statement(struct dmr_C *C, struct statement *stmt)
{
	if (!stmt)
		return NULL;

	switch (stmt->type) {
	case STMT_DECLARATION: {
		struct symbol *s;
		FOR_EACH_PTR(stmt->declaration, s) {
			evaluate_symbol(C, s);
		} END_FOR_EACH_PTR(s);
		return NULL;
	}

	case STMT_RETURN:
		return evaluate_return_expression(C, stmt);

	case STMT_EXPRESSION:
		if (!dmrC_evaluate_expression(C, stmt->expression))
			return NULL;
		if (stmt->expression->ctype == &C->S->null_ctype)
			stmt->expression = cast_to(C, stmt->expression, &C->S->ptr_ctype);
		return degenerate(C, stmt->expression);

	case STMT_COMPOUND: {
		struct statement *s;
		struct symbol *type = NULL;

		/* Evaluate the return symbol in the compound statement */
		evaluate_symbol(C, stmt->ret);

		/*
		 * Then, evaluate each statement, making the type of the
		 * compound statement be the type of the last statement
		 */
		type = dmrC_evaluate_statement(C, stmt->args);
		FOR_EACH_PTR(stmt->stmts, s) {
			type = dmrC_evaluate_statement(C, s);
		} END_FOR_EACH_PTR(s);
		if (!type)
			type = &C->S->void_ctype;
		return type;
	}
	case STMT_IF:
		evaluate_if_statement(C, stmt);
		return NULL;
	case STMT_ITERATOR:
		evaluate_iterator(C, stmt);
		return NULL;
	case STMT_SWITCH:
		evaluate_switch_statement(C, stmt);
		return NULL;
	case STMT_CASE:
		evaluate_case_statement(C, stmt);
		return NULL;
	case STMT_LABEL:
		return dmrC_evaluate_statement(C, stmt->label_statement);
	case STMT_GOTO:
		evaluate_goto_statement(C, stmt);
		return NULL;
	case STMT_NONE:
		break;
	case STMT_ASM:
		evaluate_asm_statement(C, stmt);
		return NULL;
	case STMT_CONTEXT:
		dmrC_evaluate_expression(C, stmt->expression);
		return NULL;
	case STMT_RANGE:
		dmrC_evaluate_expression(C, stmt->range_expression);
		dmrC_evaluate_expression(C, stmt->range_low);
		dmrC_evaluate_expression(C, stmt->range_high);
		return NULL;
	}
	return NULL;
}